

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  float *pfVar6;
  uint uVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  float fVar12;
  
  uVar1 = a->c;
  uVar7 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar9 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        pfVar6 = (float *)(a->cstep * uVar5 * a->elemsize + (long)a->data);
        pfVar8 = (float *)(c->cstep * uVar5 * c->elemsize + (long)c->data);
        fVar12 = 1.0 / *b->data;
        if ((int)uVar7 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            fVar2 = pfVar6[1];
            fVar3 = pfVar6[2];
            fVar4 = pfVar6[3];
            *pfVar8 = *pfVar6 * fVar12;
            pfVar8[1] = fVar2 * fVar12;
            pfVar8[2] = fVar3 * fVar12;
            pfVar8[3] = fVar4 * fVar12;
            pfVar6 = pfVar6 + 4;
            pfVar8 = pfVar8 + 4;
            iVar9 = iVar9 + 4;
            uVar10 = uVar7 & 0xfffffffc;
          } while (iVar9 < (int)uVar7);
        }
        if (uVar7 - uVar10 != 0 && (int)uVar10 <= (int)uVar7) {
          lVar11 = 0;
          do {
            pfVar8[lVar11] = pfVar6[lVar11] * fVar12;
            lVar11 = lVar11 + 1;
          } while (uVar7 - uVar10 != (int)lVar11);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}